

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

bool __thiscall
duckdb::RowGroupCollection::Append
          (RowGroupCollection *this,DataChunk *chunk,TableAppendState *state)

{
  idx_t iVar1;
  idx_t iVar2;
  DataChunk *this_00;
  bool bVar3;
  RowGroupSegmentTree *pRVar4;
  RowGroup *pRVar5;
  reference this_01;
  type this_02;
  reference v;
  pointer slice_count;
  pointer append_count;
  size_type __n;
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  local_stats_lock;
  undefined1 local_60 [16];
  DataChunk *local_50;
  pointer local_48;
  TableStatistics *local_40;
  __uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_> local_38;
  
  local_38._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>.
  super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl =
       (tuple<duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>)
       this->row_group_size;
  DataChunk::Verify(chunk);
  slice_count = (pointer)chunk->count;
  state->total_append_count =
       (long)&(slice_count->internal).
              super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
       state->total_append_count;
  local_40 = &this->stats;
  bVar3 = false;
  local_50 = chunk;
  local_48 = slice_count;
  while( true ) {
    pRVar5 = (state->row_group_append_state).row_group;
    append_count = (pointer)((long)local_38._M_t.
                                   super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
                                   .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>.
                                   _M_head_impl -
                            (state->row_group_append_state).offset_in_row_group);
    if (slice_count < append_count) {
      append_count = slice_count;
    }
    if (append_count != (pointer)0x0) {
      iVar1 = pRVar5->allocation_size;
      RowGroup::Append(pRVar5,&state->row_group_append_state,local_50,(idx_t)append_count);
      this->allocation_size = this->allocation_size + (pRVar5->allocation_size - iVar1);
      RowGroup::MergeIntoStatistics(pRVar5,local_40);
    }
    slice_count = (pointer)((long)slice_count - (long)append_count);
    if (slice_count == (pointer)0x0) break;
    if (slice_count < (pointer)local_50->count) {
      DataChunk::Slice(local_50,(idx_t)append_count,(idx_t)slice_count);
    }
    iVar1 = (state->row_group_append_state).offset_in_row_group;
    iVar2 = (pRVar5->super_SegmentBase<duckdb::RowGroup>).start;
    pRVar4 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
    local_60._0_8_ = &(pRVar4->super_SegmentTree<duckdb::RowGroup,_true>).node_lock;
    local_60[8] = false;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_60);
    local_60[8] = true;
    AppendRowGroup(this,(SegmentLock *)local_60,iVar1 + iVar2);
    pRVar4 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
    pRVar5 = SegmentTree<duckdb::RowGroup,_true>::GetLastSegment
                       (&pRVar4->super_SegmentTree<duckdb::RowGroup,_true>,(SegmentLock *)local_60);
    RowGroup::InitializeAppend(pRVar5,&state->row_group_append_state);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_60);
    bVar3 = true;
  }
  state->current_row =
       (long)&(local_48->internal).
              super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
       state->current_row;
  TableStatistics::GetLock((TableStatistics *)local_60);
  this_00 = local_50;
  if ((this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
      ::operator*((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
                   *)local_60);
      this_01 = vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true>::operator[]
                          (&(state->stats).column_stats,__n);
      this_02 = shared_ptr<duckdb::ColumnStatistics,_true>::operator*(this_01);
      v = vector<duckdb::Vector,_true>::operator[](&this_00->data,__n);
      ColumnStatistics::UpdateDistinctStatistics(this_02,v,this_00->count,&state->hashes);
      __n = __n + 1;
    } while (__n < (ulong)(((long)(this->types).
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->types).
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555));
  }
  ::std::unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ::~unique_ptr((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
                 *)local_60);
  return bVar3;
}

Assistant:

bool RowGroupCollection::Append(DataChunk &chunk, TableAppendState &state) {
	const idx_t row_group_size = GetRowGroupSize();
	D_ASSERT(chunk.ColumnCount() == types.size());
	chunk.Verify();

	bool new_row_group = false;
	idx_t total_append_count = chunk.size();
	idx_t remaining = chunk.size();
	state.total_append_count += total_append_count;
	while (true) {
		auto current_row_group = state.row_group_append_state.row_group;
		// check how much we can fit into the current row_group
		idx_t append_count =
		    MinValue<idx_t>(remaining, row_group_size - state.row_group_append_state.offset_in_row_group);
		if (append_count > 0) {
			auto previous_allocation_size = current_row_group->GetAllocationSize();
			current_row_group->Append(state.row_group_append_state, chunk, append_count);
			allocation_size += current_row_group->GetAllocationSize() - previous_allocation_size;
			// merge the stats
			current_row_group->MergeIntoStatistics(stats);
		}
		remaining -= append_count;
		if (remaining > 0) {
			// we expect max 1 iteration of this loop (i.e. a single chunk should never overflow more than one
			// row_group)
			D_ASSERT(chunk.size() == remaining + append_count);
			// slice the input chunk
			if (remaining < chunk.size()) {
				chunk.Slice(append_count, remaining);
			}
			// append a new row_group
			new_row_group = true;
			auto next_start = current_row_group->start + state.row_group_append_state.offset_in_row_group;

			auto l = row_groups->Lock();
			AppendRowGroup(l, next_start);
			// set up the append state for this row_group
			auto last_row_group = row_groups->GetLastSegment(l);
			last_row_group->InitializeAppend(state.row_group_append_state);
			continue;
		} else {
			break;
		}
	}
	state.current_row += row_t(total_append_count);

	auto local_stats_lock = state.stats.GetLock();

	for (idx_t col_idx = 0; col_idx < types.size(); col_idx++) {
		auto &column_stats = state.stats.GetStats(*local_stats_lock, col_idx);
		column_stats.UpdateDistinctStatistics(chunk.data[col_idx], chunk.size(), state.hashes);
	}

	return new_row_group;
}